

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.hpp
# Opt level: O3

void __thiscall duckdb::SecretEntry::SecretEntry(SecretEntry *this,SecretEntry *other)

{
  pointer pcVar1;
  pointer pBVar2;
  
  this->persist_type = other->persist_type;
  (this->storage_mode)._M_dataplus._M_p = (pointer)&(this->storage_mode).field_2;
  pcVar1 = (other->storage_mode)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->storage_mode,pcVar1,pcVar1 + (other->storage_mode)._M_string_length);
  if ((other->secret).
      super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
      _M_t.
      super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
      .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl == (BaseSecret *)0x0) {
    (this->secret).
    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>._M_t.
    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
    _M_t.
    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl = (BaseSecret *)0x0;
  }
  else {
    pBVar2 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
             ::operator->(&other->secret);
    (*pBVar2->_vptr_BaseSecret[5])(&this->secret,pBVar2);
  }
  return;
}

Assistant:

SecretEntry(const SecretEntry &other)
	    : persist_type(other.persist_type), storage_mode(other.storage_mode),
	      secret((other.secret != nullptr) ? other.secret->Clone() : nullptr) {
	}